

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uoptions.cpp
# Opt level: O2

int u_parseArgs(int argc,char **argv,int optionCount,UOption *options)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  UOption *pUVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  char cVar8;
  long lVar9;
  char *pcVar10;
  UOption *pUVar11;
  int iVar12;
  
  uVar5 = 0;
  uVar6 = (ulong)(uint)optionCount;
  if (optionCount < 1) {
    uVar6 = uVar5;
  }
  iVar12 = 1;
  iVar7 = 1;
  do {
    if (argc <= iVar12) {
      return iVar7;
    }
    pcVar10 = argv[iVar12];
    if ((((char)uVar5 == '\0') && (*pcVar10 == '-')) && (cVar8 = pcVar10[1], cVar8 != '\0')) {
      pcVar10 = pcVar10 + 2;
      if (cVar8 == '-') {
        uVar5 = uVar6;
        pUVar11 = options;
        if (*pcVar10 == '\0') {
          uVar5 = 1;
        }
        else {
          while( true ) {
            if (uVar5 == 0) goto LAB_001ed031;
            if ((pUVar11->longName != (char *)0x0) &&
               (iVar2 = strcmp(pcVar10,pUVar11->longName), iVar2 == 0)) break;
            uVar5 = uVar5 - 1;
            pUVar11 = pUVar11 + 1;
          }
          pUVar11->doesOccur = '\x01';
          if (pUVar11->hasArg != '\0') {
            iVar2 = iVar12 + 1;
            if ((iVar2 < argc) && ((pcVar10 = argv[iVar2], *pcVar10 != '-' || (pcVar10[1] == '\0')))
               ) {
              pUVar11->value = pcVar10;
              iVar12 = iVar2;
            }
            else if (pUVar11->hasArg == '\x01') {
LAB_001ed02c:
              pUVar11->doesOccur = '\0';
LAB_001ed031:
              return -iVar12;
            }
          }
          if (pUVar11->optionFn == (UOptionFn *)0x0) {
LAB_001ed00f:
            uVar5 = 0;
          }
          else {
            iVar2 = (*pUVar11->optionFn)(pUVar11->context,pUVar11);
            if (iVar2 < 0) {
              pUVar11->doesOccur = '\0';
              return -iVar12;
            }
            uVar5 = 0;
          }
        }
      }
      else {
        iVar2 = iVar12 + 1;
        pUVar11 = options + -1;
        lVar9 = uVar6 + 1;
        do {
          do {
            pUVar4 = pUVar11;
            if (lVar9 + -1 == 0) goto LAB_001ed031;
            pUVar11 = pUVar4 + 1;
            lVar9 = lVar9 + -1;
          } while (cVar8 != pUVar4[1].shortName);
          pUVar4[1].doesOccur = '\x01';
          if (pUVar4[1].hasArg != '\0') {
            if (*pcVar10 != '\0') {
              pUVar4[1].value = pcVar10;
              goto LAB_001ed00f;
            }
            if ((iVar2 < argc) && ((pcVar1 = argv[iVar2], *pcVar1 != '-' || (pcVar1[1] == '\0')))) {
              pUVar4[1].value = pcVar1;
              iVar12 = iVar2;
              goto LAB_001ed00f;
            }
            if (pUVar4[1].hasArg == '\x01') goto LAB_001ed02c;
          }
          if ((pUVar4[1].optionFn != (UOptionFn *)0x0) &&
             (iVar3 = (*pUVar4[1].optionFn)(pUVar4[1].context,pUVar11), iVar3 < 0))
          goto LAB_001ed02c;
          cVar8 = *pcVar10;
          pcVar10 = pcVar10 + 1;
          uVar5 = 0;
          pUVar11 = options + -1;
          lVar9 = uVar6 + 1;
        } while (cVar8 != '\0');
      }
    }
    else {
      lVar9 = (long)iVar7;
      iVar7 = iVar7 + 1;
      argv[lVar9] = pcVar10;
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

U_CAPI int U_EXPORT2
u_parseArgs(int argc, char* argv[],
            int optionCount, UOption options[]) {
    char *arg;
    int i=1, remaining=1;
    char c, stopOptions=0;

    while(i<argc) {
        arg=argv[i];
        if(!stopOptions && *arg=='-' && (c=arg[1])!=0) {
            /* process an option */
            UOption *option=NULL;
            arg+=2;
            if(c=='-') {
                /* process a long option */
                if(*arg==0) {
                    /* stop processing options after "--" */
                    stopOptions=1;
                } else {
                    /* search for the option string */
                    int j;
                    for(j=0; j<optionCount; ++j) {
                        if(options[j].longName && uprv_strcmp(arg, options[j].longName)==0) {
                            option=options+j;
                            break;
                        }
                    }
                    if(option==NULL) {
                        /* no option matches */
                        return -i;
                    }
                    option->doesOccur=1;

                    if(option->hasArg!=UOPT_NO_ARG) {
                        /* parse the argument for the option, if any */
                        if(i+1<argc && !(argv[i+1][0]=='-' && argv[i+1][1]!=0)) {
                            /* argument in the next argv[], and there is not an option in there */
                            option->value=argv[++i];
                        } else if(option->hasArg==UOPT_REQUIRES_ARG) {
                            /* there is no argument, but one is required: return with error */
                            option->doesOccur=0;
                            return -i;
                        }
                    }

                    if(option->optionFn!=NULL && option->optionFn(option->context, option)<0) {
                        /* the option function was called and returned an error */
                        option->doesOccur=0;
                        return -i;
                    }
                }
            } else {
                /* process one or more short options */
                do {
                    /* search for the option letter */
                    int j;
                    for(j=0; j<optionCount; ++j) {
                        if(c==options[j].shortName) {
                            option=options+j;
                            break;
                        }
                    }
                    if(option==NULL) {
                        /* no option matches */
                        return -i;
                    }
                    option->doesOccur=1;

                    if(option->hasArg!=UOPT_NO_ARG) {
                        /* parse the argument for the option, if any */
                        if(*arg!=0) {
                            /* argument following in the same argv[] */
                            option->value=arg;
                            /* do not process the rest of this arg as option letters */
                            break;
                        } else if(i+1<argc && !(argv[i+1][0]=='-' && argv[i+1][1]!=0)) {
                            /* argument in the next argv[], and there is not an option in there */
                            option->value=argv[++i];
                            /* this break is redundant because we know that *arg==0 */
                            break;
                        } else if(option->hasArg==UOPT_REQUIRES_ARG) {
                            /* there is no argument, but one is required: return with error */
                            option->doesOccur=0;
                            return -i;
                        }
                    }

                    if(option->optionFn!=NULL && option->optionFn(option->context, option)<0) {
                        /* the option function was called and returned an error */
                        option->doesOccur=0;
                        return -i;
                    }

                    /* get the next option letter */
                    option=NULL;
                    c=*arg++;
                } while(c!=0);
            }

            /* go to next argv[] */
            ++i;
        } else {
            /* move a non-option up in argv[] */
            argv[remaining++]=arg;
            ++i;
        }
    }
    return remaining;
}